

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

void __thiscall script_tests::script_cltv_truncated::test_method(script_cltv_truncated *this)

{
  long lVar1;
  bool bVar2;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  check_type cVar5;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  BaseSignatureChecker local_e0;
  assertion_result local_d8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  ScriptError err;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack_ignore;
  undefined1 local_78 [24];
  char **ppcStack_60;
  CScript script_cltv_trunc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._16_8_ = 0;
  ppcStack_60 = (char **)0x0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = 0;
  other = &CScript::operator<<((CScript *)local_78,OP_CHECKLOCKTIMEVERIFY)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&script_cltv_trunc.super_CScriptBase,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78);
  stack_ignore.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stack_ignore.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack_ignore.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = &DAT_000003e8;
  file.m_begin = (iterator)&local_b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c0,msg);
  local_e0._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_0113e2b0;
  bVar2 = EvalScript(&stack_ignore,&script_cltv_trunc,0x200,&local_e0,BASE,&err);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ppcStack_60 = &local_f0;
  local_f0 = 
  "!EvalScript(stack_ignore, script_cltv_trunc, SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, BaseSignatureChecker(), SigVersion::BASE, &err)"
  ;
  local_e8 = "";
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_0113a070;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_f8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_78,1,0,WARN,_cVar5,(size_t)&local_100,1000);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x3e9;
  file_00.m_begin = (iterator)&local_110;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_120,
             msg_00);
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  ppcStack_60 = (char **)0xc694e1;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_128 = "";
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x11;
  local_d8._1_3_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ScriptError_t,ScriptError_t>
            (local_78,&local_130,0x3e9,1,2,&err,"err",&local_d8,"SCRIPT_ERR_INVALID_STACK_OPERATION"
            );
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&stack_ignore);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script_cltv_trunc.super_CScriptBase)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_cltv_truncated)
{
    const auto script_cltv_trunc = CScript() << OP_CHECKLOCKTIMEVERIFY;

    std::vector<std::vector<unsigned char>> stack_ignore;
    ScriptError err;
    BOOST_CHECK(!EvalScript(stack_ignore, script_cltv_trunc, SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, BaseSignatureChecker(), SigVersion::BASE, &err));
    BOOST_CHECK_EQUAL(err, SCRIPT_ERR_INVALID_STACK_OPERATION);
}